

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O0

void m_dowear_type(level *lev,monst *mon,long flag,boolean creation,boolean racialexception)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  obj *obj_00;
  char *pcVar9;
  char *pcVar10;
  char *local_260;
  char local_248 [8];
  char buf [256];
  char nambuf [256];
  int unseen;
  int m_delay;
  obj *obj;
  obj *best;
  obj *old;
  boolean racialexception_local;
  boolean creation_local;
  long flag_local;
  monst *mon_local;
  level *lev_local;
  
  cVar3 = '\0';
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_00343aaf;
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((bVar2 = false, ublindf != (obj *)0x0 && (bVar2 = false, ublindf->oartifact == '\x1d'))))
       && (((u.uprops[0x40].intrinsic != 0 ||
            ((u.uprops[0x40].extrinsic != 0 ||
             (bVar2 = false, ((youmonst.data)->mflags3 & 0x100) != 0)))) &&
           (bVar2 = false, (mon->data->mflags3 & 0x200) != 0)))) {
      bVar1 = viz_array[mon->my][mon->mx] & 1;
      goto joined_r0x00343aa9;
    }
  }
  else {
    bVar1 = worm_known(lev,mon);
joined_r0x00343aa9:
    bVar2 = false;
    if (bVar1 != 0) {
LAB_00343aaf:
      if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) ||
          (bVar2 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         (bVar2 = false, (*(uint *)&mon->field_0x60 >> 7 & 1) == 0)) {
        bVar2 = (*(uint *)&mon->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
      }
    }
  }
  if (mon->mfrozen != '\0') {
    return;
  }
  if (((u.uprops[0xc].intrinsic == 0) && (u.uprops[0xc].extrinsic == 0)) &&
     (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
    local_260 = mon_nam(mon);
  }
  else {
    local_260 = Monnam(mon);
  }
  strcpy(buf + 0xf8,local_260);
  obj_00 = which_armor(mon,flag);
  if ((obj_00 != (obj *)0x0) && ((*(uint *)&obj_00->field_0x4a & 1) != 0)) {
    return;
  }
  if ((obj_00 != (obj *)0x0) && (flag == 0x10000)) {
    return;
  }
  obj = obj_00;
  for (_unseen = mon->minvent; _unseen != (obj *)0x0; _unseen = _unseen->nobj) {
    if (flag == 1) {
      if (((_unseen->oclass == '\x03') && (objects[_unseen->otyp].oc_subtyp == '\0')) &&
         ((racialexception == '\0' || (iVar5 = racial_exception(mon,_unseen), 0 < iVar5))))
      goto LAB_00343f5c;
    }
    else if (flag == 2) {
      if ((_unseen->oclass == '\x03') && (objects[_unseen->otyp].oc_subtyp == '\x05'))
      goto LAB_00343f5c;
    }
    else if (flag == 4) {
      if (((_unseen->oclass == '\x03') && (objects[_unseen->otyp].oc_subtyp == '\x02')) &&
         ((iVar5 = num_horns(mon->data), iVar5 < 1 ||
          (((*(ushort *)&objects[_unseen->otyp].field_0x11 >> 4 & 0x1f) < 8 ||
           (_unseen->otyp == 0x3d)))))) goto LAB_00343f5c;
    }
    else if (flag == 8) {
      if ((_unseen->oclass == '\x03') && (objects[_unseen->otyp].oc_subtyp == '\x01'))
      goto LAB_00343f5c;
    }
    else if (flag == 0x10) {
      if ((_unseen->oclass == '\x03') && (objects[_unseen->otyp].oc_subtyp == '\x03'))
      goto LAB_00343f5c;
    }
    else if (flag == 0x20) {
      if ((_unseen->oclass == '\x03') && (objects[_unseen->otyp].oc_subtyp == '\x04'))
      goto LAB_00343f5c;
    }
    else if (flag == 0x40) {
      if ((_unseen->oclass == '\x03') && (objects[_unseen->otyp].oc_subtyp == '\x06'))
      goto LAB_00343f5c;
    }
    else if (flag == 0x10000) {
      if ((_unseen->oclass == '\x05') &&
         (((_unseen->otyp == 0xca || (_unseen->otyp == 0xd0)) || ((_unseen->oprops & 0x10U) != 0))))
      {
        obj = _unseen;
        break;
      }
    }
    else {
LAB_00343f5c:
      if (_unseen->owornmask == 0) {
        if (obj != (obj *)0x0) {
          iVar5 = arm_bonus(obj,mon);
          iVar6 = extra_pref(mon,obj);
          iVar7 = arm_bonus(_unseen,mon);
          iVar8 = extra_pref(mon,_unseen);
          if (iVar7 + iVar8 <= iVar5 + iVar6) goto LAB_00343fdd;
        }
        obj = _unseen;
      }
    }
LAB_00343fdd:
  }
  if (obj == (obj *)0x0) {
    return;
  }
  if (obj == obj_00) {
    return;
  }
  if (((flag == 1) || (flag == 0x40)) && ((mon->misc_worn_check & 2U) != 0)) {
    cVar3 = '\x02';
  }
  if (obj_00 != (obj *)0x0) {
    cVar3 = objects[obj_00->otyp].oc_delay + cVar3;
    obj_00->owornmask = 0;
  }
  if (creation == '\0') {
    if (mon->wormno == '\0') {
      if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_003441c8;
      if (((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))
            ) && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         (((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          ((mon->data->mflags3 & 0x200) != 0)))) {
        bVar1 = viz_array[mon->my][mon->mx] & 1;
        goto joined_r0x003441c2;
      }
    }
    else {
      bVar1 = worm_known(lev,mon);
joined_r0x003441c2:
      if (bVar1 != 0) {
LAB_003441c8:
        if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
           ((((*(uint *)&mon->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mon->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
          if (obj_00 == (obj *)0x0) {
            local_248[0] = '\0';
          }
          else {
            pcVar9 = distant_name(obj_00,doname);
            sprintf(local_248," removes %s and",pcVar9);
          }
          pcVar9 = Monnam(mon);
          pcVar10 = distant_name(obj,doname);
          pline("%s%s puts on %s.",pcVar9,local_248,pcVar10);
        }
      }
    }
    mon->mfrozen = objects[obj->otyp].oc_delay + cVar3;
    if (mon->mfrozen != '\0') {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfffbffff;
    }
  }
  if (obj_00 != (obj *)0x0) {
    update_mon_intrinsics(lev,mon,obj_00,'\0',creation);
  }
  mon->misc_worn_check = mon->misc_worn_check | (uint)flag;
  obj->owornmask = obj->owornmask | (uint)flag;
  update_mon_intrinsics(lev,mon,obj,'\x01',creation);
  if (creation != '\0') {
    return;
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if (((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
          ((bVar4 = false, ublindf == (obj *)0x0 || (bVar4 = false, ublindf->oartifact != '\x1d'))))
         || (((u.uprops[0x40].intrinsic == 0 &&
              ((u.uprops[0x40].extrinsic == 0 &&
               (bVar4 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
             (bVar4 = false, (mon->data->mflags3 & 0x200) == 0)))) goto LAB_00344601;
      bVar1 = viz_array[mon->my][mon->mx] & 1;
      goto joined_r0x00344536;
    }
  }
  else {
    bVar1 = worm_known(lev,mon);
joined_r0x00344536:
    bVar4 = false;
    if (bVar1 == 0) goto LAB_00344601;
  }
  if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) ||
      (bVar4 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (bVar4 = false, (*(uint *)&mon->field_0x60 >> 7 & 1) == 0)) {
    bVar4 = (*(uint *)&mon->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
  }
LAB_00344601:
  if ((((bVar2 ^ 1U) != (bVar4 ^ 1U)) && ((*(uint *)&mon->field_0x60 >> 1 & 1) != 0)) &&
     ((u.uprops[0xc].intrinsic == 0 &&
      ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))))) {
    pline("Suddenly you cannot see %s.",buf + 0xf8);
    discover_object((int)obj->otyp,'\x01','\x01');
  }
  return;
}

Assistant:

static void m_dowear_type(struct level *lev, struct monst *mon, long flag,
			  boolean creation, boolean racialexception)
{
	struct obj *old, *best, *obj;
	int m_delay = 0;
	int unseen = !canseemon(lev, mon);
	char nambuf[BUFSZ];

	if (mon->mfrozen) return; /* probably putting previous item on */

	/* Get a copy of monster's name before altering its visibility */
	strcpy(nambuf, See_invisible ? Monnam(mon) : mon_nam(mon));

	old = which_armor(mon, flag);
	if (old && old->cursed) return;
	if (old && flag == W_AMUL) return; /* no such thing as better amulets */
	best = old;

	for (obj = mon->minvent; obj; obj = obj->nobj) {
	    switch(flag) {
		case W_AMUL:
		    if (obj->oclass != AMULET_CLASS ||
			    (obj->otyp != AMULET_OF_LIFE_SAVING &&
				obj->otyp != AMULET_OF_REFLECTION &&
				!(obj->oprops & ITEM_REFLECTION)))
			continue;
		    best = obj;
		    goto outer_break; /* no such thing as better amulets */
		case W_ARMU:
		    if (!is_shirt(obj)) continue;
		    break;
		case W_ARMC:
		    if (!is_cloak(obj)) continue;
		    break;
		case W_ARMH:
		    if (!is_helmet(obj)) continue;
		    /* (flimsy exception matches polyself handling) */
		    if (has_horns(mon->data) && !is_flimsy(obj)) continue;
		    break;
		case W_ARMS:
		    if (!is_shield(obj)) continue;
		    break;
		case W_ARMG:
		    if (!is_gloves(obj)) continue;
		    break;
		case W_ARMF:
		    if (!is_boots(obj)) continue;
		    break;
		case W_ARM:
		    if (!is_suit(obj)) continue;
		    if (racialexception && (racial_exception(mon, obj) < 1)) continue;
		    break;
	    }
	    if (obj->owornmask) continue;
	    /* I'd like to define a VISIBLE_ARM_BONUS which doesn't assume the
	     * monster knows obj->spe, but if I did that, a monster would keep
	     * switching forever between two -2 caps since when it took off one
	     * it would forget spe and once again think the object is better
	     * than what it already has.
	     */
	    if (best && (arm_bonus(best, mon) + extra_pref(mon, best) >=
			 arm_bonus(obj, mon) + extra_pref(mon, obj)))
		continue;
	    best = obj;
	}
outer_break:
	if (!best || best == old) return;

	/* if wearing a cloak, account for the time spent removing
	   and re-wearing it when putting on a suit or shirt */
	if ((flag == W_ARM || flag == W_ARMU) && (mon->misc_worn_check & W_ARMC))
	    m_delay += 2;
	/* when upgrading a piece of armor, account for time spent
	   taking off current one */
	if (old)
	    m_delay += objects[old->otyp].oc_delay;

	if (old) /* do this first to avoid "(being worn)" */
	    old->owornmask = 0L;
	if (!creation) {
	    if (canseemon(lev, mon)) {
		char buf[BUFSZ];

		if (old)
		    sprintf(buf, " removes %s and", distant_name(old, doname));
		else
		    buf[0] = '\0';
		pline("%s%s puts on %s.", Monnam(mon),
		      buf, distant_name(best,doname));
	    } /* can see it */
	    m_delay += objects[best->otyp].oc_delay;
	    mon->mfrozen = m_delay;
	    if (mon->mfrozen) mon->mcanmove = 0;
	}
	if (old)
	    update_mon_intrinsics(lev, mon, old, FALSE, creation);
	mon->misc_worn_check |= flag;
	best->owornmask |= flag;
	update_mon_intrinsics(lev, mon, best, TRUE, creation);
	/* if couldn't see it but now can, or vice versa, */
	if (!creation && (unseen ^ !canseemon(lev, mon))) {
		if (mon->minvis && !See_invisible) {
			pline("Suddenly you cannot see %s.", nambuf);
			makeknown(best->otyp);
		} /* else if (!mon->minvis) pline("%s suddenly appears!", Amonnam(mon)); */
	}
}